

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test2::testEnd(GPUShaderFP64Test2 *this,shaderStage shader_stage)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  shaderStage shader_stage_local;
  GPUShaderFP64Test2 *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (shader_stage == COMPUTE_SHADER) {
    (**(code **)(lVar3 + 0x80))(0,0,0,0,0,0x88b9,0x8235);
  }
  else if (shader_stage == FRAGMENT_SHADER) {
    (**(code **)(lVar3 + 0x6a0))(0x8ca9,0x8ce0,0xde1,0);
    (**(code **)(lVar3 + 0xb8))(0xde1,0);
    (**(code **)(lVar3 + 0x78))(0x8ca9,0);
  }
  else if (shader_stage - GEOMETRY_SHADER < 4) {
    (**(code **)(lVar3 + 0x638))();
    (**(code **)(lVar3 + 0x40))(0x8c8e,0);
  }
  return;
}

Assistant:

void GPUShaderFP64Test2::testEnd(shaderStage shader_stage) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	switch (shader_stage)
	{
	case GEOMETRY_SHADER:
	case TESS_CTRL_SHADER:
	case TESS_EVAL_SHADER:
	case VERTEX_SHADER:

		gl.endTransformFeedback();

		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);

		break;

	case FRAGMENT_SHADER:

		gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0 /* texture_id */,
								0 /* level */);

		gl.bindTexture(GL_TEXTURE_2D, 0);

		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);

		break;

	case COMPUTE_SHADER:

		gl.bindImageTexture(0 /* first image unit */, 0 /* texture_id */, 0 /* level */, GL_FALSE /* layered */,
							0 /* layer */, GL_WRITE_ONLY, GL_R32I);

		break;
	}
}